

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O0

bool math::matrix_is_diagonal<double>(double *mat,int rows,int cols,double *epsilon)

{
  int local_34;
  int local_30;
  int x_1;
  int x;
  int y;
  double *epsilon_local;
  int cols_local;
  int rows_local;
  double *mat_local;
  
  x_1 = 0;
  do {
    if (rows <= x_1) {
      return true;
    }
    for (local_30 = 0; local_34 = x_1, local_30 < x_1 && local_30 < cols; local_30 = local_30 + 1) {
      if ((0.0 < mat[x_1 * cols + local_30] - *epsilon) ||
         (mat[x_1 * cols + local_30] + *epsilon < 0.0)) {
        return false;
      }
    }
    while (local_34 = local_34 + 1, local_34 < cols) {
      if ((0.0 < mat[x_1 * cols + local_34] - *epsilon) ||
         (mat[x_1 * cols + local_34] + *epsilon < 0.0)) {
        return false;
      }
    }
    x_1 = x_1 + 1;
  } while( true );
}

Assistant:

bool
matrix_is_diagonal (T* const mat, int rows, int cols, T const& epsilon)
{
    for (int y = 0; y < rows; ++y)
    {
        for (int x = 0; x < y && x < cols; ++x)
            if (!MATH_EPSILON_EQ(T(0), mat[y * cols + x], epsilon))
                return false;
        for (int x = y + 1; x < cols; ++x)
            if (!MATH_EPSILON_EQ(T(0), mat[y * cols + x], epsilon))
                return false;
    }
    return true;
}